

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

void __thiscall
Clasp::mt::LocalDistribution::publish(LocalDistribution *this,Solver *s,SharedLiterals *n)

{
  __pointer_type pNVar1;
  uint uVar2;
  SolverStrategies SVar3;
  ThreadData *pTVar4;
  __base_type _Var5;
  uint32 i;
  uint uVar6;
  uint tId;
  uint32 local_3c;
  
  SVar3 = s->strategy_;
  tId = SVar3._4_4_ >> 0x1a;
  uVar2 = n->size_type_;
  local_3c = 0;
  for (uVar6 = 0; uVar6 != this->numThread_; uVar6 = uVar6 + 1) {
    if (tId != uVar6) {
      if ((uVar2 < 8) || ((this->thread_[uVar6]->peers & 1L << (SVar3._7_1_ >> 2)) != 0)) {
        _Var5._M_p = &allocNode(this,tId,n)->super_RawNode;
        pTVar4 = this->thread_[uVar6];
        LOCK();
        (_Var5._M_p)->next = (SafeNodePtr)0x0;
        UNLOCK();
        LOCK();
        pNVar1 = (pTVar4->received).head_._M_b._M_p;
        (pTVar4->received).head_._M_b._M_p = (__pointer_type)_Var5._M_p;
        UNLOCK();
        LOCK();
        (pNVar1->super_RawNode).next._M_b._M_p = _Var5._M_p;
        UNLOCK();
      }
      else {
        local_3c = local_3c + 1;
      }
    }
  }
  if (local_3c != 0) {
    SharedLiterals::release(n,local_3c);
    return;
  }
  return;
}

Assistant:

void LocalDistribution::publish(const Solver& s, SharedLiterals* n) {
	assert(n->refCount() >= (numThread_-1));
	uint32 sender = s.id();
	uint32 size   = n->size();
	uint32 decRef = 0;
	for (uint32 i = 0; i != numThread_; ++i) {
		if (i == sender) { continue; }
		if (size > 1 && !inSet(thread_[i]->peers, sender)) { ++decRef; }
		else {
			QNode* node = allocNode(sender, n);
			thread_[i]->received.push(node);
		}
	}
	if (decRef) { n->release(decRef); }
}